

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patchtexture.cpp
# Opt level: O2

FTexture * PatchTexture_TryCreate(FileReader *file,int lumpnum)

{
  short sVar1;
  short *psVar2;
  FPatchTexture *this;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  patch_t header;
  
  if (0xc < file->Length) {
    psVar2 = (short *)operator_new__(file->Length);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,psVar2,file->Length);
    sVar1 = *psVar2;
    if ((ushort)(sVar1 - 1U) < 0x800 && (ushort)(psVar2[1] - 1U) < 0x800) {
      uVar5 = (uint)sVar1;
      if ((long)(ulong)uVar5 < file->Length / 4) {
        bVar4 = true;
        uVar3 = 0;
        do {
          if (uVar5 == uVar3) {
            operator_delete__(psVar2);
            if (bVar4) {
              return (FTexture *)0x0;
            }
            (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
            (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&header,2);
            (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&header.height,2);
            (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&header.leftoffset,2);
            (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&header.topoffset,2);
            this = (FPatchTexture *)operator_new(0x70);
            FPatchTexture::FPatchTexture(this,lumpnum,&header);
            return &this->super_FTexture;
          }
          if (*(uint *)(psVar2 + uVar3 * 2 + 4) == uVar5 * 4 + 8) {
            bVar4 = false;
          }
          else if ((uint)file->Length <= *(uint *)(psVar2 + uVar3 * 2 + 4)) break;
          uVar3 = uVar3 + 1;
        } while( true );
      }
    }
    operator_delete__(psVar2);
  }
  return (FTexture *)0x0;
}

Assistant:

FTexture *PatchTexture_TryCreate(FileReader & file, int lumpnum)
{
	patch_t header;

	if (!CheckIfPatch(file)) return NULL;
	file.Seek(0, SEEK_SET);
	file >> header.width >> header.height >> header.leftoffset >> header.topoffset;
	return new FPatchTexture(lumpnum, &header);
}